

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

void cargo_destroy(cargo_t *ctx)

{
  cargo_t ctx_00;
  cargo_opt_t *__ptr;
  cargo_group_t *pcVar1;
  char **ppcVar2;
  int *__ptr_00;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  
  if (ctx == (cargo_t *)0x0) {
    return;
  }
  ctx_00 = *ctx;
  if ((ctx_00->flags & CARGO_AUTOCLEAN) != 0) {
    _cargo_cleanup_option_values(ctx_00,1);
  }
  if (ctx_00->options != (cargo_opt_t *)0x0) {
    if (ctx_00->opt_count != 0) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        _cargo_option_destroy((cargo_opt_t *)((long)ctx_00->options->name + lVar5));
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x128;
      } while (uVar4 < ctx_00->opt_count);
    }
    __ptr = ctx_00->options;
    if (__ptr != (cargo_opt_t *)0x0) {
      if (replaced_cargo_free == (cargo_free_f)0x0) {
        free(__ptr);
      }
      else {
        (*replaced_cargo_free)(__ptr);
      }
      ctx_00->options = (cargo_opt_t *)0x0;
    }
  }
  if (ctx_00 != (cargo_t)0x0) {
    if (ctx_00->groups != (cargo_group_t *)0x0) {
      if (ctx_00->group_count != 0) {
        lVar5 = 0;
        uVar4 = 0;
        do {
          _cargo_group_destroy((cargo_group_t *)((long)&ctx_00->groups->name + lVar5));
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 0x48;
        } while (uVar4 < ctx_00->group_count);
      }
      pcVar1 = ctx_00->groups;
      if (pcVar1 != (cargo_group_t *)0x0) {
        if (replaced_cargo_free == (cargo_free_f)0x0) {
          free(pcVar1);
        }
        else {
          (*replaced_cargo_free)(pcVar1);
        }
        ctx_00->groups = (cargo_group_t *)0x0;
      }
    }
    if (ctx_00->mutex_groups != (cargo_group_t *)0x0) {
      if (ctx_00->mutex_group_count != 0) {
        lVar5 = 0;
        uVar4 = 0;
        do {
          _cargo_group_destroy((cargo_group_t *)((long)&ctx_00->mutex_groups->name + lVar5));
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 0x48;
        } while (uVar4 < ctx_00->mutex_group_count);
      }
      pcVar1 = ctx_00->mutex_groups;
      if (pcVar1 != (cargo_group_t *)0x0) {
        if (replaced_cargo_free == (cargo_free_f)0x0) {
          free(pcVar1);
        }
        else {
          (*replaced_cargo_free)(pcVar1);
        }
        ctx_00->mutex_groups = (cargo_group_t *)0x0;
      }
    }
    ppcVar2 = ctx_00->args;
    if (ppcVar2 != (char **)0x0) {
      if (replaced_cargo_free == (cargo_free_f)0x0) {
        free(ppcVar2);
      }
      else {
        (*replaced_cargo_free)(ppcVar2);
      }
      ctx_00->args = (char **)0x0;
    }
    ppcVar2 = ctx_00->unknown_opts;
    if (ppcVar2 != (char **)0x0) {
      if (replaced_cargo_free == (cargo_free_f)0x0) {
        free(ppcVar2);
      }
      else {
        (*replaced_cargo_free)(ppcVar2);
      }
      ctx_00->unknown_opts = (char **)0x0;
    }
    __ptr_00 = ctx_00->unknown_opts_idxs;
    if (__ptr_00 != (int *)0x0) {
      if (replaced_cargo_free == (cargo_free_f)0x0) {
        free(__ptr_00);
      }
      else {
        (*replaced_cargo_free)(__ptr_00);
      }
      ctx_00->unknown_opts_idxs = (int *)0x0;
    }
    pcVar3 = ctx_00->error;
    if (pcVar3 != (char *)0x0) {
      if (replaced_cargo_free == (cargo_free_f)0x0) {
        free(pcVar3);
      }
      else {
        (*replaced_cargo_free)(pcVar3);
      }
      ctx_00->error = (char *)0x0;
    }
    pcVar3 = ctx_00->short_usage;
    if (pcVar3 != (char *)0x0) {
      if (replaced_cargo_free == (cargo_free_f)0x0) {
        free(pcVar3);
      }
      else {
        (*replaced_cargo_free)(pcVar3);
      }
      ctx_00->short_usage = (char *)0x0;
    }
    pcVar3 = ctx_00->usage;
    if (pcVar3 != (char *)0x0) {
      if (replaced_cargo_free == (cargo_free_f)0x0) {
        free(pcVar3);
      }
      else {
        (*replaced_cargo_free)(pcVar3);
      }
      ctx_00->usage = (char *)0x0;
    }
    pcVar3 = ctx_00->description;
    if (pcVar3 != (char *)0x0) {
      if (replaced_cargo_free == (cargo_free_f)0x0) {
        free(pcVar3);
      }
      else {
        (*replaced_cargo_free)(pcVar3);
      }
      ctx_00->description = (char *)0x0;
    }
    pcVar3 = ctx_00->epilog;
    if (pcVar3 != (char *)0x0) {
      if (replaced_cargo_free == (cargo_free_f)0x0) {
        free(pcVar3);
      }
      else {
        (*replaced_cargo_free)(pcVar3);
      }
      ctx_00->epilog = (char *)0x0;
    }
    _cargo_xfree(ctx_00);
    if (replaced_cargo_free != (cargo_free_f)0x0) {
      (*replaced_cargo_free)(*ctx);
      return;
    }
    free(*ctx);
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0xd5a,"void _cargo_groups_destroy(cargo_t)");
}

Assistant:

void cargo_destroy(cargo_t *ctx)
{
    size_t i;

    CARGODBG(2, "cargo_destroy: DESTROY!\n");

    if (ctx)
    {
        cargo_opt_t *opt;
        cargo_t c = *ctx;

        if (c->flags & CARGO_AUTOCLEAN)
        {
            CARGODBG(2, "Auto clean target values\n");
            _cargo_cleanup_option_values(c, 1);
        }

        if (c->options)
        {
            CARGODBG(2, "DESTROY %lu options!\n", c->opt_count);

            for (i = 0; i < c->opt_count; i++)
            {
                opt = &c->options[i];
                CARGODBG(2, "Free opt: %s\n", opt->name[0]);
                _cargo_option_destroy(opt);
            }

            _cargo_xfree(&c->options);
        }

        _cargo_groups_destroy(c);

        _cargo_free_str_list(&c->args, NULL);
        _cargo_free_str_list(&c->unknown_opts, NULL);

        _cargo_xfree(&c->unknown_opts_idxs);
        _cargo_xfree(&c->error);
        _cargo_xfree(&c->short_usage);
        _cargo_xfree(&c->usage);
        _cargo_xfree(&c->description);
        _cargo_xfree(&c->epilog);
        _cargo_xfree(&c->progname);

        _cargo_free(*ctx);
        ctx = NULL;
    }
}